

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O2

qint64 __thiscall QNetworkDiskCache::expire(QNetworkDiskCache *this)

{
  long lVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  pointer pCVar7;
  pointer __last;
  ulong uVar8;
  _Tp_alloc_type *__alloc;
  ulong uVar9;
  long lVar10;
  pointer __first;
  __normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_> __i;
  long in_FS_OFFSET;
  QLatin1String QVar11;
  pointer local_a0;
  pointer local_98;
  CacheItem local_88;
  Data local_60;
  QDateTime fileTime;
  QTimeZone local_50;
  DirEntry local_48;
  QDirListing local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(this + 8);
  lVar10 = *(long *)(lVar5 + 0xd0);
  if ((lVar10 < 0) || (*(long *)(lVar5 + 200) <= lVar10)) {
    cacheDirectory((QString *)&local_88,this);
    lVar10 = CONCAT44(local_88.path.d.ptr._4_4_,local_88.path.d.ptr._0_4_);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (lVar10 == 0) {
      local_88.msecs.__r._0_4_ = 2;
      local_88.path.d.ptr._4_4_ = 0;
      local_88.msecs.__r._4_4_ = 0;
      local_88.path.d.d._0_4_ = 0;
      local_88.path.d.d._4_4_ = 0;
      local_88.path.d.ptr._0_4_ = 0;
      local_88.path.d.size = 0x23d1aa;
      lVar10 = 0;
      QMessageLogger::warning
                ((char *)&local_88,"QNetworkDiskCache::expire() The cache directory is not set");
    }
    else {
      QCacheItem::reset((QCacheItem *)(lVar5 + 0x78));
      cacheDirectory((QString *)&local_88,this);
      QDirListing::QDirListing(local_40,&local_88,0x418);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      local_48.dirListPtr = (QDirListingPrivate *)QDirListing::begin();
      local_a0 = (pointer)0x0;
      __last = (CacheItem *)0x0;
      local_98 = (pointer)0x0;
      __first = (pointer)0x0;
      lVar10 = 0;
      for (; local_48.dirListPtr != (QDirListingPrivate *)0x0;
          local_48.dirListPtr = (QDirListingPrivate *)QDirListing::next(local_48)) {
        QDirListing::DirEntry::fileName();
        QVar11.m_data = (char *)0x2;
        QVar11.m_size = (qsizetype)&local_88;
        cVar3 = QString::endsWith(QVar11,0x2484ed);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        if (cVar3 != '\0') {
          QDirListing::DirEntry::fileInfo();
          _fileTime = &DAT_aaaaaaaaaaaaaaaa;
          local_88.msecs.__r._0_4_ = 2;
          local_88.msecs.__r._4_4_ = 0;
          QFileInfo::birthTime((QFileInfo *)&fileTime,&local_50);
          QTimeZone::~QTimeZone((QTimeZone *)&local_88);
          cVar3 = QDateTime::isValid();
          if (cVar3 == '\0') {
            local_60 = (Data)0x2;
            QFileInfo::metadataChangeTime((QFileInfo *)&local_88,&local_50);
            puVar2 = (undefined1 *)CONCAT44(local_88.msecs.__r._4_4_,(undefined4)local_88.msecs.__r)
            ;
            local_88.msecs.__r._0_4_ = SUB84(_fileTime,0);
            local_88.msecs.__r._4_4_ = (undefined4)((ulong)_fileTime >> 0x20);
            _fileTime = puVar2;
            QDateTime::~QDateTime((QDateTime *)&local_88);
            QTimeZone::~QTimeZone((QTimeZone *)&local_60.s);
          }
          uVar4 = QDateTime::toMSecsSinceEpoch();
          lVar5 = QFileInfo::size();
          local_88.msecs.__r._0_4_ = (undefined4)uVar4;
          local_88.msecs.__r._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          QFileInfo::filePath();
          local_88.size = lVar5;
          if (__last == local_98) {
            if ((long)__last - (long)__first == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar6 = ((long)__last - (long)__first) / 0x28;
            uVar8 = uVar6;
            if (__last == __first) {
              uVar8 = 1;
            }
            uVar9 = uVar8 + uVar6;
            __alloc = (_Tp_alloc_type *)0x333333333333333;
            if (0x333333333333332 < uVar9) {
              uVar9 = 0x333333333333333;
            }
            if (CARRY8(uVar8,uVar6)) {
              uVar9 = 0x333333333333333;
            }
            if (uVar9 == 0) {
              local_a0 = (pointer)0x0;
            }
            else {
              local_a0 = (pointer)operator_new(uVar9 * 0x28);
            }
            expire::CacheItem::CacheItem(local_a0 + uVar6,&local_88);
            pCVar7 = std::vector<CacheItem,_std::allocator<CacheItem>_>::_S_relocate
                               (__first,__last,local_a0,__alloc);
            __last = std::vector<CacheItem,_std::allocator<CacheItem>_>::_S_relocate
                               (__last,__last,pCVar7 + 1,__alloc);
            std::_Vector_base<CacheItem,_std::allocator<CacheItem>_>::_M_deallocate
                      ((_Vector_base<CacheItem,_std::allocator<CacheItem>_> *)__first,
                       (pointer)(((long)local_98 - (long)__first) / 0x28),
                       ((long)local_98 - (long)__first) % 0x28);
            local_98 = local_a0 + uVar9;
          }
          else {
            expire::CacheItem::CacheItem(__last,&local_88);
            __last = __last + 1;
          }
          if (local_a0 == __last) {
            std::__replacement_assert
                      ("/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/bits/stl_vector.h"
                       ,0x479,
                       "reference std::vector<CacheItem>::back() [_Tp = CacheItem, _Alloc = std::allocator<CacheItem>]"
                       ,"!this->empty()");
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88.path.d);
          lVar10 = lVar10 + lVar5;
          QDateTime::~QDateTime(&fileTime);
          QFileInfo::~QFileInfo((QFileInfo *)&local_50);
          __first = local_a0;
        }
      }
      QDirListing::~QDirListing(local_40);
      lVar5 = (*(long *)(*(long *)(this + 8) + 200) * 9) / 10;
      pCVar7 = __first;
      if (lVar5 <= lVar10) {
        if (__first != __last) {
          uVar8 = ((long)__last - (long)__first) / 0x28;
          lVar1 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                    (__first,__last,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)__last - (long)__first < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                      (__first,__last);
          }
          else {
            pCVar7 = __first + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                      (__first,pCVar7);
            for (; pCVar7 != __last; pCVar7 = pCVar7 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Val_comp_iter<QNetworkDiskCache::expire()::__0>>
                        (pCVar7);
            }
          }
        }
        do {
          pCVar7 = local_a0;
          if (__first == __last) break;
          QFile::remove((QString *)&__first->path);
          lVar10 = lVar10 - __first->size;
          __first = __first + 1;
        } while (lVar5 <= lVar10);
      }
      for (; pCVar7 != __last; pCVar7 = pCVar7 + 1) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&(pCVar7->path).d);
      }
      std::_Vector_base<CacheItem,_std::allocator<CacheItem>_>::_M_deallocate
                ((_Vector_base<CacheItem,_std::allocator<CacheItem>_> *)local_a0,
                 (pointer)(((long)local_98 - (long)local_a0) / 0x28),
                 ((long)local_98 - (long)local_a0) % 0x28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar10;
}

Assistant:

qint64 QNetworkDiskCache::expire()
{
    Q_D(QNetworkDiskCache);
    if (d->currentCacheSize >= 0 && d->currentCacheSize < maximumCacheSize())
        return d->currentCacheSize;

    if (cacheDirectory().isEmpty()) {
        qWarning("QNetworkDiskCache::expire() The cache directory is not set");
        return 0;
    }

    // close file handle to prevent "in use" error when QFile::remove() is called
    d->lastItem.reset();

    struct CacheItem
    {
        std::chrono::milliseconds msecs;
        QString path;
        qint64 size = 0;
    };
    std::vector<CacheItem> cacheItems;
    qint64 totalSize = 0;
    using F = QDirListing::IteratorFlag;
    for (const auto &dirEntry : QDirListing(cacheDirectory(), F::FilesOnly | F::Recursive)) {
        if (!dirEntry.fileName().endsWith(CACHE_POSTFIX))
            continue;

        const QFileInfo &info = dirEntry.fileInfo();
        QDateTime fileTime = info.birthTime(QTimeZone::UTC);
        if (!fileTime.isValid())
            fileTime = info.metadataChangeTime(QTimeZone::UTC);
        const std::chrono::milliseconds msecs{fileTime.toMSecsSinceEpoch()};
        const qint64 size = info.size();
        cacheItems.push_back(CacheItem{msecs, info.filePath(), size});
        totalSize += size;
    }

    const qint64 goal = (maximumCacheSize() * 9) / 10;
    if (totalSize < goal)
        return totalSize; // Nothing to do

    auto byFileTime = [&](const auto &a, const auto &b) { return a.msecs < b.msecs; };
    std::sort(cacheItems.begin(), cacheItems.end(), byFileTime);

    [[maybe_unused]] int removedFiles = 0; // used under QNETWORKDISKCACHE_DEBUG
    for (const CacheItem &cached : cacheItems) {
        QFile::remove(cached.path);
        ++removedFiles;
        totalSize -= cached.size;
        if (totalSize < goal)
            break;
    }
#if defined(QNETWORKDISKCACHE_DEBUG)
    if (removedFiles > 0) {
        qDebug() << "QNetworkDiskCache::expire()"
                << "Removed:" << removedFiles
                << "Kept:" << cacheItems.count() - removedFiles;
    }
#endif
    return totalSize;
}